

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyVarcharOperator>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  undefined1 uVar1;
  long lVar2;
  value_type vVar3;
  TYPE input;
  bool bVar4;
  string_t *psVar5;
  idx_t iVar6;
  idx_t iVar7;
  reference pvVar8;
  long in_RSI;
  long in_RDI;
  idx_t b;
  idx_t encode_len;
  data_ptr_t result_ptr;
  value_type *offset;
  idx_t idx;
  idx_t result_index;
  idx_t r;
  unsafe_vector<idx_t> *offsets;
  string_t *data;
  size_type in_stack_ffffffffffffff88;
  SortKeyChunk *this;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  idx_t in_stack_ffffffffffffffb0;
  ulong local_28;
  
  this = (SortKeyChunk *)&stack0x00000008;
  psVar5 = UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)(in_RDI + 0x10));
  for (local_28 = this->start; local_28 < this->end; local_28 = local_28 + 1) {
    iVar6 = SortKeyChunk::GetResultIndex(this,local_28);
    iVar7 = SelectionVector::get_index(*(SelectionVector **)(in_RDI + 0x10),local_28);
    pvVar8 = vector<unsigned_long,_false>::operator[]
                       ((vector<unsigned_long,_false> *)this,in_stack_ffffffffffffff88);
    lVar2 = *(long *)(*(long *)(in_RSI + 0x10) + iVar6 * 8);
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffff98,(idx_t)this);
    if (bVar4) {
      uVar1 = *(undefined1 *)(in_RDI + 0x71);
      vVar3 = *pvVar8;
      *pvVar8 = vVar3 + 1;
      *(undefined1 *)(lVar2 + vVar3) = uVar1;
      input.value.pointer.ptr = (char *)in_stack_ffffffffffffffb0;
      input.value._0_8_ = psVar5[iVar7].value.pointer.ptr;
      in_stack_ffffffffffffffb0 =
           SortKeyVarcharOperator::Encode(*(data_ptr_t *)&psVar5[iVar7].value,input);
      if ((*(byte *)(in_RSI + 0x18) & 1) != 0) {
        for (in_stack_ffffffffffffff98 = (TemplatedValidityMask<unsigned_long> *)*pvVar8;
            in_stack_ffffffffffffff98 <
            (TemplatedValidityMask<unsigned_long> *)(*pvVar8 + in_stack_ffffffffffffffb0);
            in_stack_ffffffffffffff98 =
                 (TemplatedValidityMask<unsigned_long> *)
                 ((long)&in_stack_ffffffffffffff98->validity_mask + 1)) {
          *(byte *)((long)&in_stack_ffffffffffffff98->validity_mask + lVar2) =
               *(byte *)((long)&in_stack_ffffffffffffff98->validity_mask + lVar2) ^ 0xff;
        }
      }
      *pvVar8 = in_stack_ffffffffffffffb0 + *pvVar8;
    }
    else {
      uVar1 = *(undefined1 *)(in_RDI + 0x70);
      vVar3 = *pvVar8;
      *pvVar8 = vVar3 + 1;
      *(undefined1 *)(lVar2 + vVar3) = uVar1;
    }
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}